

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_law_expansion.cc
# Opt level: O3

bool __thiscall sptk::ALawExpansion::Run(ALawExpansion *this,double input,double *output)

{
  double dVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double local_38;
  
  bVar4 = (bool)(output != (double *)0x0 & this->is_valid_);
  if (bVar4 == true) {
    local_38 = ABS(input);
    dVar1 = this->abs_max_value_;
    dVar2 = log(this->compression_factor_);
    auVar5._8_8_ = local_38;
    auVar5._0_8_ = 0x3ff0000000000000;
    auVar6._8_4_ = SUB84(dVar1,0);
    auVar6._0_8_ = dVar2 + 1.0;
    auVar6._12_4_ = (int)((ulong)dVar1 >> 0x20);
    auVar6 = divpd(auVar5,auVar6);
    dVar1 = (dVar2 + 1.0) * auVar6._8_8_;
    if (auVar6._0_8_ <= auVar6._8_8_) {
      dVar1 = exp(dVar1 + -1.0);
    }
    dVar2 = this->constant_;
    iVar3 = ExtractSign(input);
    *output = (double)iVar3 * dVar2 * dVar1;
  }
  return bVar4;
}

Assistant:

bool ALawExpansion::Run(double input, double* output) const {
  if (!is_valid_ || NULL == output) {
    return false;
  }

  const double x(std::fabs(input) / abs_max_value_);
  const double z(1 + std::log(compression_factor_));
  double y(z * x);
  if (1.0 / z <= x) {
    y = std::exp(y - 1.0);
  }
  *output = constant_ * sptk::ExtractSign(input) * y;

  return true;
}